

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall
sptk::Matrix::Matrix
          (Matrix *this,int num_row,int num_column,vector<double,_std::allocator<double>_> *vector)

{
  size_type __n;
  reference pvVar1;
  reference ppdVar2;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  int i;
  allocator_type *__a;
  vector<double_*,_std::allocator<double_*>_> *this_00;
  int local_54;
  int local_44;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd4;
  vector<double_*,_std::allocator<double_*>_> local_19;
  
  *in_RDI = &PTR__Matrix_0013ad18;
  local_44 = in_ESI;
  if (in_ESI < 0) {
    local_44 = 0;
  }
  *(int *)&(((vector<double,_std::allocator<double>_> *)(in_RDI + 1))->
           super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start = local_44;
  local_54 = in_EDX;
  if (in_EDX < 0) {
    local_54 = 0;
  }
  *(int *)((long)in_RDI + 0xc) = local_54;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (vector<double,_std::allocator<double>_> *)(in_RDI + 1));
  __a = (allocator_type *)(in_RDI + 5);
  __n = (size_type)*(int *)(in_RDI + 1);
  this_00 = &local_19;
  std::allocator<double_*>::allocator((allocator<double_*> *)0x1299a3);
  std::vector<double_*,_std::allocator<double_*>_>::vector(this_00,__n,__a);
  std::allocator<double_*>::~allocator((allocator<double_*> *)0x1299c3);
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 1); iVar3 = iVar3 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),
                        (long)(iVar3 * *(int *)((long)in_RDI + 0xc)));
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 5),(long)iVar3);
    *ppdVar2 = pvVar1;
  }
  return;
}

Assistant:

Matrix::Matrix(int num_row, int num_column, const std::vector<double>& vector)
    : num_row_(num_row < 0 ? 0 : num_row),
      num_column_(num_column < 0 ? 0 : num_column),
      data_(vector),
      index_(num_row_) {
  for (int i(0); i < num_row_; ++i) {
    index_[i] = &data_[i * num_column_];
  }
}